

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Matrix *matrix)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  ostream *poVar2;
  uint j;
  ulong uVar3;
  uint i;
  uint index;
  
  for (index = 0; index < (matrix->m_shape).field_0.m_dims[0]; index = index + 1) {
    for (uVar3 = 0; uVar3 < (matrix->m_shape).field_0.m_dims[1]; uVar3 = uVar3 + 1) {
      pvVar1 = Matrix::operator[](matrix,index);
      poVar2 = std::ostream::_M_insert<double>
                         ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
      std::operator<<(poVar2,"\t");
    }
    std::operator<<(out,'\n');
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Matrix& matrix){
    for(uint i=0;i<matrix.m_shape.n_row;++i){
        for(uint j=0;j<matrix.m_shape.n_col;++j){
            out<<matrix[i][j]<<"\t";
        }   out<<'\n';
    }

    return out;
}